

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

ON_BoundingBox * __thiscall
ON_RTree::BoundingBox(ON_BoundingBox *__return_storage_ptr__,ON_RTree *this)

{
  double *pdVar1;
  double dVar2;
  int local_14;
  int i;
  ON_RTree *this_local;
  
  ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__);
  if ((this->m_root != (ON_RTreeNode *)0x0) && (0 < this->m_root->m_count)) {
    ON_3dPoint::operator=(&__return_storage_ptr__->m_min,(double *)this->m_root->m_branch);
    ON_3dPoint::operator=(&__return_storage_ptr__->m_max,this->m_root->m_branch[0].m_rect.m_max);
    for (local_14 = 1; local_14 < this->m_root->m_count; local_14 = local_14 + 1) {
      if (this->m_root->m_branch[local_14].m_rect.m_min[0] < (__return_storage_ptr__->m_min).x) {
        (__return_storage_ptr__->m_min).x = this->m_root->m_branch[local_14].m_rect.m_min[0];
      }
      if (this->m_root->m_branch[local_14].m_rect.m_min[1] < (__return_storage_ptr__->m_min).y) {
        (__return_storage_ptr__->m_min).y = this->m_root->m_branch[local_14].m_rect.m_min[1];
      }
      if (this->m_root->m_branch[local_14].m_rect.m_min[2] < (__return_storage_ptr__->m_min).z) {
        (__return_storage_ptr__->m_min).z = this->m_root->m_branch[local_14].m_rect.m_min[2];
      }
      dVar2 = this->m_root->m_branch[local_14].m_rect.m_max[0];
      if ((__return_storage_ptr__->m_max).x <= dVar2 && dVar2 != (__return_storage_ptr__->m_max).x)
      {
        (__return_storage_ptr__->m_max).x = this->m_root->m_branch[local_14].m_rect.m_max[0];
      }
      dVar2 = this->m_root->m_branch[local_14].m_rect.m_max[1];
      pdVar1 = &(__return_storage_ptr__->m_max).y;
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        (__return_storage_ptr__->m_max).y = this->m_root->m_branch[local_14].m_rect.m_max[1];
      }
      dVar2 = this->m_root->m_branch[local_14].m_rect.m_max[2];
      pdVar1 = &(__return_storage_ptr__->m_max).z;
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        (__return_storage_ptr__->m_max).z = this->m_root->m_branch[local_14].m_rect.m_max[2];
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_BoundingBox ON_RTree::BoundingBox() const
{
  ON_BoundingBox bbox;
  if ( 0 != m_root && m_root->m_count > 0 )
  {
    bbox.m_min = m_root->m_branch[0].m_rect.m_min;
    bbox.m_max = m_root->m_branch[0].m_rect.m_max;
    for ( int i = 1; i < m_root->m_count; i++ )
    {
      if ( m_root->m_branch[i].m_rect.m_min[0] < bbox.m_min.x )
        bbox.m_min.x = m_root->m_branch[i].m_rect.m_min[0];
      if ( m_root->m_branch[i].m_rect.m_min[1] < bbox.m_min.y )
        bbox.m_min.y = m_root->m_branch[i].m_rect.m_min[1];
      if ( m_root->m_branch[i].m_rect.m_min[2] < bbox.m_min.z )
        bbox.m_min.z = m_root->m_branch[i].m_rect.m_min[2];

      if ( m_root->m_branch[i].m_rect.m_max[0] > bbox.m_max.x )
        bbox.m_max.x = m_root->m_branch[i].m_rect.m_max[0];
      if ( m_root->m_branch[i].m_rect.m_max[1] > bbox.m_max.y )
        bbox.m_max.y = m_root->m_branch[i].m_rect.m_max[1];
      if ( m_root->m_branch[i].m_rect.m_max[2] > bbox.m_max.z )
        bbox.m_max.z = m_root->m_branch[i].m_rect.m_max[2];
    }
  }
  return bbox;
}